

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compress.c
# Opt level: O1

void bsPutUInt32(EState *s,UInt32 u)

{
  int iVar1;
  int iVar2;
  uint uVar3;
  uint uVar4;
  
  uVar4 = s->bsLive;
  if (7 < (int)uVar4) {
    do {
      s->zbits[s->numZ] = *(UChar *)((long)&s->bsBuff + 3);
      s->numZ = s->numZ + 1;
      s->bsBuff = s->bsBuff << 8;
      iVar2 = s->bsLive;
      uVar4 = iVar2 - 8;
      s->bsLive = uVar4;
    } while (0xf < iVar2);
  }
  uVar3 = uVar4 + 8;
  s->bsBuff = s->bsBuff | (u >> 0x18) << (0x18U - (char)uVar4 & 0x1f);
  s->bsLive = uVar3;
  if (uVar4 < 0x7ffffff8) {
    do {
      s->zbits[s->numZ] = *(UChar *)((long)&s->bsBuff + 3);
      s->numZ = s->numZ + 1;
      s->bsBuff = s->bsBuff << 8;
      iVar2 = s->bsLive;
      uVar3 = iVar2 - 8;
      s->bsLive = uVar3;
    } while (0xf < iVar2);
  }
  s->bsBuff = s->bsBuff | (u >> 0x10 & 0xff) << (0x18U - (char)uVar3 & 0x1f);
  uVar4 = uVar3 + 8;
  s->bsLive = uVar4;
  if (uVar3 < 0x7ffffff8) {
    do {
      s->zbits[s->numZ] = *(UChar *)((long)&s->bsBuff + 3);
      s->numZ = s->numZ + 1;
      s->bsBuff = s->bsBuff << 8;
      iVar2 = s->bsLive;
      uVar4 = iVar2 - 8;
      s->bsLive = uVar4;
    } while (0xf < iVar2);
  }
  s->bsBuff = s->bsBuff | (u >> 8 & 0xff) << (0x18U - (char)uVar4 & 0x1f);
  iVar2 = uVar4 + 8;
  s->bsLive = iVar2;
  if (uVar4 < 0x7ffffff8) {
    do {
      s->zbits[s->numZ] = *(UChar *)((long)&s->bsBuff + 3);
      s->numZ = s->numZ + 1;
      s->bsBuff = s->bsBuff << 8;
      iVar1 = s->bsLive;
      iVar2 = iVar1 + -8;
      s->bsLive = iVar2;
    } while (0xf < iVar1);
  }
  s->bsBuff = s->bsBuff | (u & 0xff) << (0x18U - (char)iVar2 & 0x1f);
  s->bsLive = iVar2 + 8;
  return;
}

Assistant:

static
void bsPutUInt32 ( EState* s, UInt32 u )
{
   bsW ( s, 8, (u >> 24) & 0xffL );
   bsW ( s, 8, (u >> 16) & 0xffL );
   bsW ( s, 8, (u >>  8) & 0xffL );
   bsW ( s, 8,  u        & 0xffL );
}